

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptPreQualifier(HlslGrammar *this,TQualifier *qualifier)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  ulong uVar3;
  uint uVar4;
  HlslParseContext *this_00;
  TLayoutGeometry local_2c;
  
LAB_00331512:
  do {
    EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    bVar1 = true;
    switch(EVar2) {
    case EHTokStatic:
      uVar3 = (*(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80) + 1;
      break;
    case EHTokConst:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 2;
      break;
    default:
      goto switchD_00331531_caseD_3;
    case EHTokExtern:
    case EHTokShared:
    case EHTokInline:
      goto switchD_00331531_caseD_5;
    case EHTokUniform:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 5;
      break;
    case EHTokVolatile:
      uVar3 = 0x4000000000000;
      goto LAB_003316f6;
    case EHTokPrecise:
      uVar3 = 0x1000000000;
      goto LAB_003316f6;
    case EHTokGroupShared:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 7;
      break;
    case EHTokLinear:
      uVar3 = 0x40000000;
      goto LAB_003316f6;
    case EHTokCentroid:
      uVar3 = 0x20000000;
      goto LAB_003316f6;
    case EHTokNointerpolation:
      uVar3 = 0x80000000;
      goto LAB_003316f6;
    case EHTokNoperspective:
      uVar3 = 0x2000000000;
      goto LAB_003316f6;
    case EHTokSample:
      uVar3 = 0x200000000000;
      goto LAB_003316f6;
    case EHTokRowMajor:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
      break;
    case EHTokColumnMajor:
      uVar3 = (*(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000;
      break;
    case EHTokIn:
      uVar4 = (uint)*(ulong *)&qualifier->field_0x8 & 0x7f;
      if (uVar4 != 5) {
        uVar3 = (*(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80) + (ulong)(uVar4 == 0x11) * 2
                + 0x10;
        break;
      }
      goto switchD_00331531_caseD_5;
    case EHTokOut:
      uVar3 = (*(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80) +
              (ulong)(((uint)*(ulong *)&qualifier->field_0x8 & 0x7f) == 0x10) + 0x11;
      break;
    case EHTokInOut:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x12;
      break;
    case EHTokLayout:
      goto switchD_00331531_caseD_16;
    case EHTokGloballyCoherent:
      uVar3 = 0x2000000000000;
LAB_003316f6:
      uVar3 = uVar3 | *(ulong *)&qualifier->field_0x8;
      break;
    case EHTokPoint:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgPoints;
      goto LAB_00331722;
    case EHTokLine:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgLines;
      goto LAB_00331722;
    case EHTokTriangle:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgTriangles;
      goto LAB_00331722;
    case EHTokLineAdj:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgLinesAdjacency;
      goto LAB_00331722;
    case EHTokTriangleAdj:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgTrianglesAdjacency;
LAB_00331722:
      bVar1 = HlslParseContext::handleInputGeometry
                        (this_00,&(this->super_HlslTokenStream).token.loc,&local_2c);
      if (bVar1) goto switchD_00331531_caseD_5;
      goto LAB_0033173b;
    }
    *(ulong *)&qualifier->field_0x8 = uVar3;
switchD_00331531_caseD_5:
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  } while( true );
switchD_00331531_caseD_16:
  bVar1 = acceptLayoutQualifierList(this,qualifier);
  if (!bVar1) {
LAB_0033173b:
    bVar1 = false;
switchD_00331531_caseD_3:
    return bVar1;
  }
  goto LAB_00331512;
}

Assistant:

bool HlslGrammar::acceptPreQualifier(TQualifier& qualifier)
{
    do {
        switch (peek()) {
        case EHTokStatic:
            qualifier.storage = EvqGlobal;
            break;
        case EHTokExtern:
            // TODO: no meaning in glslang?
            break;
        case EHTokShared:
            // TODO: hint
            break;
        case EHTokGroupShared:
            qualifier.storage = EvqShared;
            break;
        case EHTokUniform:
            qualifier.storage = EvqUniform;
            break;
        case EHTokConst:
            qualifier.storage = EvqConst;
            break;
        case EHTokVolatile:
            qualifier.volatil = true;
            break;
        case EHTokLinear:
            qualifier.smooth = true;
            break;
        case EHTokCentroid:
            qualifier.centroid = true;
            break;
        case EHTokNointerpolation:
            qualifier.flat = true;
            break;
        case EHTokNoperspective:
            qualifier.nopersp = true;
            break;
        case EHTokSample:
            qualifier.sample = true;
            break;
        case EHTokRowMajor:
            qualifier.layoutMatrix = ElmColumnMajor;
            break;
        case EHTokColumnMajor:
            qualifier.layoutMatrix = ElmRowMajor;
            break;
        case EHTokPrecise:
            qualifier.noContraction = true;
            break;
        case EHTokIn:
            if (qualifier.storage != EvqUniform) {
                qualifier.storage = (qualifier.storage == EvqOut) ? EvqInOut : EvqIn;
            }
            break;
        case EHTokOut:
            qualifier.storage = (qualifier.storage == EvqIn) ? EvqInOut : EvqOut;
            break;
        case EHTokInOut:
            qualifier.storage = EvqInOut;
            break;
        case EHTokLayout:
            if (! acceptLayoutQualifierList(qualifier))
                return false;
            continue;
        case EHTokGloballyCoherent:
            qualifier.coherent = true;
            break;
        case EHTokInline:
            // TODO: map this to SPIR-V function control
            break;

        // GS geometries: these are specified on stage input variables, and are an error (not verified here)
        // for output variables.
        case EHTokPoint:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgPoints))
                return false;
            break;
        case EHTokLine:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgLines))
                return false;
            break;
        case EHTokTriangle:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgTriangles))
                return false;
            break;
        case EHTokLineAdj:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgLinesAdjacency))
                return false;
            break;
        case EHTokTriangleAdj:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgTrianglesAdjacency))
                return false;
            break;

        default:
            return true;
        }
        advanceToken();
    } while (true);
}